

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::(anonymous_namespace)::LayeredImage::setPixel<tcu::Vector<unsigned_int,4>>
          (LayeredImage *this,int x,int y,int z,Vector<unsigned_int,_4> *color)

{
  long lVar1;
  ConstPixelBufferAccess *pCVar2;
  PixelBufferAccess access;
  ConstPixelBufferAccess local_50;
  
  switch(*(undefined4 *)this) {
  case 0:
    lVar1 = *(long *)(this + 0x28);
    break;
  case 1:
    pCVar2 = *(ConstPixelBufferAccess **)
              (*(long *)(this + 0x38) + 0xa0 +
              (ulong)(uint)(&glslImageFuncZToCubeFace(int)::faces)[z] * 0x18);
    goto LAB_00458f25;
  case 2:
    lVar1 = *(long *)(this + 0x58);
    break;
  case 3:
    lVar1 = *(long *)(this + 0x48);
    break;
  default:
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_50);
    goto LAB_00458f2f;
  case 7:
    lVar1 = *(long *)(this + 0x18);
  }
  pCVar2 = *(ConstPixelBufferAccess **)(lVar1 + 0x20);
LAB_00458f25:
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_50,pCVar2);
LAB_00458f2f:
  if (*(int *)this == 1) {
    z = 0;
  }
  tcu::PixelBufferAccess::setPixel((PixelBufferAccess *)&local_50,color,x,y,z);
  return;
}

Assistant:

void LayeredImage::setPixel (int x, int y, int z, const ColorT& color) const
{
	const PixelBufferAccess access = m_type == TEXTURETYPE_BUFFER		? m_texBuffer->getLevel(0)
								   : m_type == TEXTURETYPE_2D			? m_tex2D->getLevel(0)
								   : m_type == TEXTURETYPE_CUBE			? m_texCube->getLevelFace(0, glslImageFuncZToCubeFace(z))
								   : m_type == TEXTURETYPE_3D			? m_tex3D->getLevel(0)
								   : m_type == TEXTURETYPE_2D_ARRAY		? m_tex2DArray->getLevel(0)
								   : PixelBufferAccess();

	access.setPixel(color, x, y, m_type == TEXTURETYPE_CUBE ? 0 : z);
}